

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

bool Dominates(VmBlock *a,VmBlock *b)

{
  bool bVar1;
  VmBlock **ppVVar2;
  uint index;
  bool bVar3;
  
  if (a == b) {
    bVar3 = true;
  }
  else {
    index = 0;
    do {
      bVar3 = index < (a->dominanceChildren).count;
      if (!bVar3) {
        return bVar3;
      }
      ppVVar2 = SmallArray<VmBlock_*,_4U>::operator[](&a->dominanceChildren,index);
      if (*ppVVar2 == b) {
        return bVar3;
      }
      bVar1 = Dominates(*ppVVar2,b);
      index = index + 1;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

bool Dominates(VmBlock *a, VmBlock *b)
{
	if(a == b)
		return true;

	for(unsigned i = 0; i < a->dominanceChildren.size(); i++)
	{
		VmBlock *child = a->dominanceChildren[i];

		if(child == b)
			return true;

		if(Dominates(child, b))
			return true;
	}

	return false;
}